

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O2

bool __thiscall Diligent::DearchiverBase::Store(DearchiverBase *this,IDataBlob **ppArchive)

{
  pointer pAVar1;
  _Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false> Src;
  Uint32 ContentVersion;
  ArchiveData *Archive;
  pointer pAVar2;
  bool bVar3;
  string msg;
  DeviceObjectArchive local_110;
  
  if (ppArchive == (IDataBlob **)0x0) {
    FormatString<char[27]>((string *)&local_110,(char (*) [27])"ppArchive must not be null");
    DebugAssertionFailed
              ((Char *)local_110.m_NamedResources._M_h._M_buckets,"Store",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x361);
    std::__cxx11::string::~string((string *)&local_110);
    bVar3 = false;
  }
  else {
    if (*ppArchive != (IDataBlob *)0x0) {
      FormatString<char[125]>
                ((string *)&local_110,
                 (char (*) [125])
                 "*ppArchive must be null - make sure you are not overwriting reference to an existing object as this will cause memory leaks."
                );
      DebugAssertionFailed
                ((Char *)local_110.m_NamedResources._M_h._M_buckets,"Store",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                 ,0x365);
      std::__cxx11::string::~string((string *)&local_110);
    }
    pAVar2 = (this->m_Archives).
             super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pAVar2 == (this->m_Archives).
                  super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      ContentVersion = 0;
    }
    else {
      ContentVersion =
           ((pAVar2->pObjArchive)._M_t.
            super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
            ._M_t.
            super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
            .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>._M_head_impl)->
           m_ContentVersion;
    }
    DeviceObjectArchive::DeviceObjectArchive(&local_110,ContentVersion);
    pAVar1 = (this->m_Archives).
             super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pAVar2 = (this->m_Archives).
                  super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
                  ._M_impl.super__Vector_impl_data._M_start; pAVar2 != pAVar1; pAVar2 = pAVar2 + 1)
    {
      Src._M_head_impl =
           (pAVar2->pObjArchive)._M_t.
           super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
           .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>._M_head_impl;
      if (Src._M_head_impl != (DeviceObjectArchive *)0x0) {
        DeviceObjectArchive::Merge(&local_110,Src._M_head_impl);
      }
    }
    DeviceObjectArchive::Serialize(&local_110,ppArchive);
    bVar3 = *ppArchive != (IDataBlob *)0x0;
    DeviceObjectArchive::~DeviceObjectArchive(&local_110);
  }
  return bVar3;
}

Assistant:

bool DearchiverBase::Store(IDataBlob** ppArchive) const
{
    if (ppArchive == nullptr)
    {
        DEV_ERROR("ppArchive must not be null");
        return false;
    }
    DEV_CHECK_ERR(*ppArchive == nullptr, "*ppArchive must be null - make sure you are not overwriting "
                                         "reference to an existing object as this will cause memory leaks.");

    try
    {
        DeviceObjectArchive MergedArchive{!m_Archives.empty() ? m_Archives.front().pObjArchive->GetContentVersion() : 0};
        for (const ArchiveData& Archive : m_Archives)
        {
            if (Archive.pObjArchive)
                MergedArchive.Merge(*Archive.pObjArchive);
        }

        MergedArchive.Serialize(ppArchive);
        return *ppArchive != nullptr;
    }
    catch (...)
    {
        return false;
    }
}